

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  string *psVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  Token *pTVar4;
  unsigned_long i;
  unsigned_long i_00;
  protobuf *this_00;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  double local_118;
  double value;
  protobuf *local_f0;
  uint64 value_2;
  string local_e0;
  uint64 local_c0;
  uint64 max_value_1;
  protobuf *local_98;
  uint64 value_1;
  uint64 max_value;
  string *local_80;
  string *default_value;
  LocationRecorder location;
  allocator local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)field_location;
  field_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar2 = FieldDescriptorProto::has_default_value(field);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Already set option \"default\".",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    FieldDescriptorProto::clear_default_value((FieldDescriptorProto *)field_location_local);
  }
  bVar2 = Consume(this,"default");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_004c15a9;
  }
  bVar2 = Consume(this,"=");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_004c15a9;
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)&default_value,(LocationRecorder *)containing_file_local,7);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)&default_value,(Message *)field_location_local,DEFAULT_VALUE);
  local_80 = FieldDescriptorProto::mutable_default_value_abi_cxx11_
                       ((FieldDescriptorProto *)field_location_local);
  bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)field_location_local);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
    switch(FVar3) {
    case FieldDescriptorProto_Type_TYPE_DOUBLE:
    case FieldDescriptorProto_Type_TYPE_FLOAT:
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_80);
      }
      this_00 = (protobuf *)&local_118;
      bVar2 = ConsumeNumber(this,(double *)this_00,"Expected number.");
      psVar1 = local_80;
      if (bVar2) {
        SimpleDtoa_abi_cxx11_(&local_138,this_00,local_118);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_138);
        goto switchD_004c0ed3_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_INT64:
    case FieldDescriptorProto_Type_TYPE_INT32:
    case FieldDescriptorProto_Type_TYPE_SFIXED32:
    case FieldDescriptorProto_Type_TYPE_SFIXED64:
    case FieldDescriptorProto_Type_TYPE_SINT32:
    case FieldDescriptorProto_Type_TYPE_SINT64:
      value_1 = 0x7fffffffffffffff;
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if (((FVar3 == FieldDescriptorProto_Type_TYPE_INT32) ||
          (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
          FVar3 == FieldDescriptorProto_Type_TYPE_SINT32)) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_SFIXED32)) {
        value_1 = 0x7fffffff;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_80);
        value_1 = value_1 + 1;
      }
      bVar2 = ConsumeInteger64(this,value_1,(uint64 *)&local_98,
                               "Expected integer for field default value.");
      psVar1 = local_80;
      if (bVar2) {
        SimpleItoa_abi_cxx11_((string *)&max_value_1,local_98,i);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&max_value_1);
        goto switchD_004c0ed3_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_UINT64:
    case FieldDescriptorProto_Type_TYPE_FIXED64:
    case FieldDescriptorProto_Type_TYPE_FIXED32:
    case FieldDescriptorProto_Type_TYPE_UINT32:
      local_c0 = 0xffffffffffffffff;
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if ((FVar3 == FieldDescriptorProto_Type_TYPE_UINT32) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_FIXED32)) {
        local_c0 = 0xffffffff;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e0,"Unsigned field can\'t have negative default value.",
                   (allocator *)((long)&value_2 + 7));
        AddError(this,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
      }
      bVar2 = ConsumeInteger64(this,local_c0,(uint64 *)&local_f0,
                               "Expected integer for field default value.");
      psVar1 = local_80;
      if (bVar2) {
        SimpleItoa_abi_cxx11_((string *)&value,local_f0,i_00);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&value);
        goto switchD_004c0ed3_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BOOL:
      bVar2 = TryConsume(this,"true");
      if (bVar2) {
        std::__cxx11::string::assign((char *)local_80);
      }
      else {
        bVar2 = TryConsume(this,"false");
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_158,"Expected \"true\" or \"false\".",&local_159);
          AddError(this,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          this_local._7_1_ = 0;
          break;
        }
        std::__cxx11::string::assign((char *)local_80);
      }
    default:
switchD_004c0ed3_default:
      this_local._7_1_ = 1;
      break;
    case FieldDescriptorProto_Type_TYPE_STRING:
      bVar2 = ConsumeString(this,local_80,"Expected string for field default value.");
      if (bVar2) goto switchD_004c0ed3_default;
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_GROUP:
    case FieldDescriptorProto_Type_TYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a0,"Messages can\'t have default values.",&local_1a1);
      AddError(this,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BYTES:
      bVar2 = ConsumeString(this,local_80,"Expected string.");
      if (bVar2) {
        CEscape(&local_180,local_80);
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        goto switchD_004c0ed3_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_ENUM:
      bVar2 = ConsumeIdentifier(this,local_80,"Expected enum identifier for field default value.");
      if (bVar2) goto switchD_004c0ed3_default;
      this_local._7_1_ = 0;
    }
  }
  else {
    pTVar4 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)local_80,(string *)&pTVar4->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = 1;
  }
  max_value._4_4_ = 1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)&default_value);
LAB_004c15a9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64 max_value = kint64max;
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = kint32max;
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64 max_value = kuint64max;
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = kuint32max;
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file opton java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value, "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value, "Expected enum identifier for field "
                                          "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}